

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O1

KFLOAT32 __thiscall KDIS::DATA_TYPE::Vector::GetDistance(Vector *this,Vector *Other)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  Vector v;
  DataTypeBase local_18;
  float local_10;
  float fStack_c;
  float local_8;
  
  local_18._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_002216b8;
  uVar1 = this->m_f32X;
  uVar2 = this->m_f32Y;
  fVar3 = (float)uVar1 - (float)Other->m_f32X;
  fVar4 = (float)uVar2 - (float)Other->m_f32Y;
  _local_10 = CONCAT44(fVar4,fVar3);
  local_8 = (float)this->m_f32Z - (float)Other->m_f32Z;
  fVar3 = local_8 * local_8 + fVar3 * fVar3 + fVar4 * fVar4;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  DataTypeBase::~DataTypeBase(&local_18);
  return (KFLOAT32)fVar3;
}

Assistant:

KFLOAT32 Vector::GetDistance( const Vector & Other )
{
    Vector v = *this - Other;
    return v.GetMagnitude();
}